

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PortReferenceSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PortReferenceSyntax,slang::parsing::Token,slang::syntax::ElementSelectSyntax*>
          (BumpAllocator *this,Token *args,ElementSelectSyntax **args_1)

{
  PortReferenceSyntax *this_00;
  BumpAllocator *in_RDX;
  Token *in_RSI;
  ElementSelectSyntax *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  this_00 = (PortReferenceSyntax *)
            allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  slang::syntax::PortReferenceSyntax::PortReferenceSyntax(this_00,*in_RSI,in_stack_ffffffffffffffc8)
  ;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }